

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::SequenceException::SequenceException<std::__cxx11::string,long>
          (SequenceException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,long params_1)

{
  long in_R8;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)params);
  Exception::ConstructMessage<std::__cxx11::string,long>
            (&local_60,(Exception *)msg,&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1,in_R8);
  SequenceException(this,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

explicit SequenceException(const string &msg, ARGS... params)
	    : SequenceException(ConstructMessage(msg, params...)) {
	}